

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

UInt32 crnlib::Bt3_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  byte *cur;
  CLzRef *pCVar1;
  UInt32 UVar2;
  ulong uVar3;
  UInt32 *pUVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  UInt32 UVar8;
  long lVar9;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 3) {
    MatchFinder_MovePos(p);
    UVar8 = 0;
  }
  else {
    cur = p->buffer;
    uVar6 = (uint)cur[1] ^ p->crc[*cur];
    uVar7 = uVar6 & 0x3ff;
    UVar8 = p->pos;
    pCVar1 = p->hash;
    uVar5 = UVar8 - pCVar1[uVar7];
    uVar6 = (((uint)cur[2] << 8 ^ uVar6) & p->hashMask) + 0x400;
    UVar2 = pCVar1[uVar6];
    pCVar1[uVar6] = UVar8;
    pCVar1[uVar7] = UVar8;
    UVar8 = p->cyclicBufferSize;
    uVar3 = 2;
    if ((uVar5 < UVar8) && (cur[-(ulong)uVar5] == *cur)) {
      uVar3 = 2;
      while (uVar6 = (uint)uVar3, lenLimit != uVar6) {
        if (cur[uVar3 - uVar5] != cur[uVar3]) {
          *distances = uVar6;
          distances[1] = uVar5 - 1;
          UVar8 = p->cyclicBufferSize;
          lVar9 = 2;
          goto LAB_00183a7a;
        }
        uVar3 = (ulong)(uVar6 + 1);
      }
      *distances = lenLimit;
      distances[1] = uVar5 - 1;
      SkipMatchesSpec(lenLimit,UVar2,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar2 = p->pos + 1;
      p->pos = UVar2;
      UVar8 = 2;
    }
    else {
      lVar9 = 0;
LAB_00183a7a:
      pUVar4 = GetMatchesSpec1(lenLimit,UVar2,p->pos,cur,p->son,p->cyclicBufferPos,UVar8,p->cutValue
                               ,distances + lVar9,(UInt32)uVar3);
      UVar8 = (UInt32)((ulong)((long)pUVar4 - (long)distances) >> 2);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar2 = p->pos + 1;
      p->pos = UVar2;
    }
    if (UVar2 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return UVar8;
}

Assistant:

static UInt32 Bt3_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, delta2, maxLen, offset;
  GET_MATCHES_HEADER(3)

  HASH3_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  curMatch = p->hash[kFix3HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hashValue] = p->pos;

  maxLen = 2;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[0] = maxLen;
    distances[1] = delta2 - 1;
    offset = 2;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  GET_MATCHES_FOOTER(offset, maxLen)
}